

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

void __thiscall btDbvt::update(btDbvt *this,btDbvtNode *leaf,btDbvtVolume *volume)

{
  undefined8 *in_RDX;
  btDbvtNode *in_RSI;
  btDbvtNode *in_RDI;
  bool bVar1;
  btDbvt *unaff_retaddr;
  int i;
  btDbvtNode *root;
  int local_24;
  btDbvtNode *local_20;
  btDbvtNode *root_00;
  
  root_00 = in_RDI;
  local_20 = removeleaf((btDbvt *)leaf,(btDbvtNode *)volume);
  if ((local_20 != (btDbvtNode *)0x0) && (-1 < (int)(in_RDI->volume).mx.m_floats[0])) {
    local_24 = 0;
    while( true ) {
      bVar1 = false;
      if (local_24 < (int)(in_RDI->volume).mx.m_floats[0]) {
        bVar1 = local_20->parent != (btDbvtNode *)0x0;
      }
      if (!bVar1) break;
      local_20 = local_20->parent;
      local_24 = local_24 + 1;
    }
  }
  *(undefined8 *)(in_RSI->volume).mi.m_floats = *in_RDX;
  *(undefined8 *)((in_RSI->volume).mi.m_floats + 2) = in_RDX[1];
  *(undefined8 *)(in_RSI->volume).mx.m_floats = in_RDX[2];
  *(undefined8 *)((in_RSI->volume).mx.m_floats + 2) = in_RDX[3];
  insertleaf(unaff_retaddr,root_00,in_RSI);
  return;
}

Assistant:

void			btDbvt::update(btDbvtNode* leaf,btDbvtVolume& volume)
{
	btDbvtNode*	root=removeleaf(this,leaf);
	if(root)
	{
		if(m_lkhd>=0)
		{
			for(int i=0;(i<m_lkhd)&&root->parent;++i)
			{
				root=root->parent;
			}
		} else root=m_root;
	}
	leaf->volume=volume;
	insertleaf(this,root,leaf);
}